

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::AncillaryMessage>::setCapacity(Vector<kj::AncillaryMessage> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::AncillaryMessage> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::AncillaryMessage> newBuilder;
  size_t newSize_local;
  Vector<kj::AncillaryMessage> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::AncillaryMessage>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::AncillaryMessage>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::AncillaryMessage>
            ((ArrayBuilder<kj::AncillaryMessage> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::AncillaryMessage>>(&this->builder);
  ArrayBuilder<kj::AncillaryMessage>::addAll<kj::ArrayBuilder<kj::AncillaryMessage>>
            ((ArrayBuilder<kj::AncillaryMessage> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::AncillaryMessage>>
                     ((ArrayBuilder<kj::AncillaryMessage> *)local_38);
  ArrayBuilder<kj::AncillaryMessage>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::AncillaryMessage>::~ArrayBuilder((ArrayBuilder<kj::AncillaryMessage> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }